

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O0

unique_ptr<Image,_std::default_delete<Image>_> __thiscall
ImageT<unsigned_char,_2U>::resample
          (ImageT<unsigned_char,_2U> *this,uint32_t targetWidth,uint32_t targetHeight,char *filter,
          float filterScale,Boundary_Op wrapMode)

{
  Color *pCVar1;
  string_view fmt;
  byte bVar2;
  uint uVar3;
  pointer pIVar4;
  uint *puVar5;
  runtime_error *this_00;
  pointer pRVar6;
  byte *pbVar7;
  reference pvVar8;
  reference pvVar9;
  value_type pfVar10;
  reference ppfVar11;
  uchar *puVar12;
  int in_ECX;
  int iVar13;
  uint in_EDX;
  long in_RSI;
  v10 *this_01;
  __uniq_ptr_data<Image,_std::default_delete<Image>,_true,_true> in_RDI;
  value_type vVar14;
  float fVar15;
  uchar unormValue;
  float outValue;
  float linearValue;
  uint32_t c_3;
  Color *targetPixel;
  uint32_t targetX;
  uint32_t c_2;
  array<const_float_*,_2UL> outputLine;
  uint32_t c_1;
  float value;
  uint32_t c;
  Color *sourcePixel;
  uint32_t sourceX;
  uint32_t sourceY;
  uint32_t targetY;
  TransferFunction *tf;
  TransferFunctionLinear tfLinear;
  TransferFunctionSRGB tfSRGB;
  uint32_t i;
  bool isHDR;
  array<std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>,_2UL> resamplers
  ;
  array<std::vector<float,_std::allocator<float>_>,_2UL> samples;
  uint32_t sourceHeight;
  uint32_t sourceWidth;
  __single_object target;
  unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_> *in_stack_fffffffffffffcd8;
  array<std::vector<float,_std::allocator<float>_>,_2UL> *in_stack_fffffffffffffce0;
  unique_ptr<ImageT<unsigned_char,_2U>,_std::default_delete<ImageT<unsigned_char,_2U>_>_>
  *in_stack_fffffffffffffce8;
  array<std::vector<float,_std::allocator<float>_>,_2UL> *in_stack_fffffffffffffcf0;
  Contrib_List **__new_size;
  uint *in_stack_fffffffffffffd00;
  vector<float,_std::allocator<float>_> *this_02;
  uint *in_stack_fffffffffffffd08;
  uint *in_stack_fffffffffffffd20;
  undefined4 in_stack_fffffffffffffd28;
  undefined4 in_stack_fffffffffffffd2c;
  undefined1 in_stack_fffffffffffffd30;
  undefined1 in_stack_fffffffffffffd31;
  undefined1 in_stack_fffffffffffffd32;
  uchar uVar16;
  undefined1 in_stack_fffffffffffffd33;
  undefined4 in_stack_fffffffffffffd34;
  Resampler *local_2c8;
  undefined4 in_stack_fffffffffffffd50;
  undefined4 in_stack_fffffffffffffd54;
  float *in_stack_fffffffffffffd58;
  Resampler *pRVar17;
  undefined4 in_stack_fffffffffffffd60;
  float in_stack_fffffffffffffd64;
  Resampler *in_stack_fffffffffffffd68;
  Resampler *resampler;
  Contrib_List **in_stack_fffffffffffffd70;
  float *in_stack_fffffffffffffd78;
  Contrib_List *__args_13;
  bool local_226;
  uint local_21c;
  uint local_210;
  uint local_20c;
  undefined1 local_208 [20];
  uint local_1f4;
  float local_1f0;
  uint local_1ec;
  color<unsigned_char,_2U> *local_1e8;
  uint local_1dc;
  uint local_1d8;
  int local_1d4;
  Resampler *local_1d0;
  Resampler local_1c8 [8];
  Resampler local_1c0 [8];
  uint local_1b8;
  Boundary_Op local_1b4;
  Contrib_List *local_1b0;
  undefined1 local_1a8 [12];
  undefined1 local_19c [12];
  uint local_190;
  undefined1 local_189;
  float local_188 [17];
  undefined1 local_141;
  anon_union_16_16_d721ec3a_for_value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_1
  local_140;
  char *local_130 [2];
  string local_120 [32];
  uint local_100;
  uint local_fc [4];
  undefined1 local_ec [12];
  int local_e0;
  uint local_dc [5];
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_int> *local_c8 [2];
  format_args in_stack_ffffffffffffff48;
  undefined8 uVar18;
  char *local_88;
  size_t sStack_80;
  string *local_78;
  char *local_70;
  char **local_68;
  char **local_60;
  char *local_58;
  size_t sStack_50;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_int> **local_48;
  undefined1 *local_40;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_int> **local_38;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_int> **local_30;
  undefined8 local_28;
  undefined1 *local_20;
  char *local_18;
  char **local_10;
  char *local_8;
  
  local_e0 = in_ECX;
  local_dc[0] = in_EDX;
  std::make_unique<ImageT<unsigned_char,2u>,unsigned_int&,unsigned_int&>
            (in_stack_fffffffffffffd08,in_stack_fffffffffffffd00);
  pIVar4 = std::
           unique_ptr<ImageT<unsigned_char,_2U>,_std::default_delete<ImageT<unsigned_char,_2U>_>_>::
           operator->((unique_ptr<ImageT<unsigned_char,_2U>,_std::default_delete<ImageT<unsigned_char,_2U>_>_>
                       *)0x14f47b);
  Image::setTransferFunction(&pIVar4->super_Image,*(khr_df_transfer_e *)(in_RSI + 0x10));
  pIVar4 = std::
           unique_ptr<ImageT<unsigned_char,_2U>,_std::default_delete<ImageT<unsigned_char,_2U>_>_>::
           operator->((unique_ptr<ImageT<unsigned_char,_2U>,_std::default_delete<ImageT<unsigned_char,_2U>_>_>
                       *)0x14f49b);
  Image::setPrimaries(&pIVar4->super_Image,*(khr_df_primaries_e *)(in_RSI + 0x14));
  local_fc[0] = *(uint *)(in_RSI + 8);
  local_100 = *(uint *)(in_RSI + 0xc);
  local_226 = false;
  if (((local_fc[0] != 0) && (local_226 = false, local_100 != 0)) &&
     (local_226 = false, local_dc[0] != 0)) {
    local_226 = local_e0 != 0;
  }
  if (local_226) {
    this_01 = (v10 *)&local_100;
    puVar5 = std::max<unsigned_int>(local_fc,(uint *)this_01);
    if (*puVar5 < 0x4001) {
      this_01 = (v10 *)&local_e0;
      puVar5 = std::max<unsigned_int>(local_dc,(uint *)this_01);
      if (*puVar5 < 0x4001) {
        std::array<std::vector<float,_std::allocator<float>_>,_2UL>::array
                  (in_stack_fffffffffffffcf0);
        std::array<std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>,_2UL>
        ::array((array<std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>,_2UL>
                 *)in_stack_fffffffffffffcf0);
        local_189 = 0;
        for (local_190 = 0; local_190 < 2; local_190 = local_190 + 1) {
          local_19c._0_4_ = 0;
          local_1a8._8_4_ = 0x3f800000;
          if (local_190 == 0) {
            __args_13 = (Contrib_List *)0x0;
          }
          else {
            std::
            array<std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>,_2UL>
            ::operator[]((array<std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>,_2UL>
                          *)in_stack_fffffffffffffce0,(size_type)in_stack_fffffffffffffcd8);
            pRVar6 = std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>::
                     operator->((unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>
                                 *)0x14f8c7);
            __args_13 = basisu::Resampler::get_clist_x(pRVar6);
          }
          local_1a8._0_8_ = __args_13;
          if (local_190 == 0) {
            local_1b0 = (Contrib_List *)0x0;
          }
          else {
            std::
            array<std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>,_2UL>
            ::operator[]((array<std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>,_2UL>
                          *)in_stack_fffffffffffffce0,(size_type)in_stack_fffffffffffffcd8);
            pRVar6 = std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>::
                     operator->((unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>
                                 *)0x14f916);
            local_1b0 = basisu::Resampler::get_clist_y(pRVar6);
          }
          local_1b4 = BOUNDARY_WRAP;
          local_1b8 = 0;
          this_02 = (vector<float,_std::allocator<float>_> *)local_ec;
          __new_size = &local_1b0;
          in_stack_fffffffffffffcf0 =
               (array<std::vector<float,_std::allocator<float>_>,_2UL> *)local_1a8;
          in_stack_fffffffffffffce8 =
               (unique_ptr<ImageT<unsigned_char,_2U>,_std::default_delete<ImageT<unsigned_char,_2U>_>_>
                *)(local_ec + 4);
          in_stack_fffffffffffffce0 =
               (array<std::vector<float,_std::allocator<float>_>,_2UL> *)(local_1a8 + 8);
          in_stack_fffffffffffffcd8 =
               (unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_> *)local_19c;
          std::
          make_unique<basisu::Resampler,unsigned_int_const&,unsigned_int_const&,unsigned_int&,unsigned_int&,basisu::Resampler::Boundary_Op&,float,float,char_const*&,basisu::Resampler::Contrib_List*,basisu::Resampler::Contrib_List*,float&,float&,float,float>
                    ((uint *)CONCAT44(in_stack_fffffffffffffd34,
                                      CONCAT13(in_stack_fffffffffffffd33,
                                               CONCAT12(in_stack_fffffffffffffd32,
                                                        CONCAT11(in_stack_fffffffffffffd31,
                                                                 in_stack_fffffffffffffd30)))),
                     (uint *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),
                     in_stack_fffffffffffffd20,&local_1b8,&local_1b4,
                     (float *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
                     in_stack_fffffffffffffd58,
                     (char **)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                     (Contrib_List **)in_stack_fffffffffffffd68,in_stack_fffffffffffffd70,
                     in_stack_fffffffffffffd78,(float *)&stack0xfffffffffffffcd8,(float *)local_1b0,
                     (float *)__args_13);
          in_stack_fffffffffffffd78 = local_188;
          std::
          array<std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>,_2UL>::
          operator[]((array<std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>,_2UL>
                      *)in_stack_fffffffffffffce0,(size_type)in_stack_fffffffffffffcd8);
          in_stack_fffffffffffffd70 = (Contrib_List **)(local_19c + 4);
          std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>::operator=
                    ((unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_> *)
                     in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
          std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>::~unique_ptr
                    ((unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_> *)
                     in_stack_fffffffffffffce0);
          std::
          array<std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>,_2UL>::
          operator[]((array<std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>,_2UL>
                      *)in_stack_fffffffffffffce0,(size_type)in_stack_fffffffffffffcd8);
          std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>::operator*
                    ((unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_> *)
                     in_stack_fffffffffffffce0);
          checkResamplerStatus
                    (in_stack_fffffffffffffd68,
                     (char *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
          std::array<std::vector<float,_std::allocator<float>_>,_2UL>::operator[]
                    (in_stack_fffffffffffffce0,(size_type)in_stack_fffffffffffffcd8);
          std::vector<float,_std::allocator<float>_>::resize(this_02,(size_type)__new_size);
        }
        TransferFunctionSRGB::TransferFunctionSRGB
                  ((TransferFunctionSRGB *)in_stack_fffffffffffffce0);
        TransferFunctionLinear::TransferFunctionLinear
                  ((TransferFunctionLinear *)in_stack_fffffffffffffce0);
        if (*(int *)(in_RSI + 0x10) == 2) {
          resampler = local_1c0;
        }
        else {
          resampler = local_1c8;
        }
        local_1d4 = 0;
        local_1d0 = resampler;
        for (local_1d8 = 0; local_1d8 < local_100; local_1d8 = local_1d8 + 1) {
          for (local_1dc = 0; local_1dc < local_fc[0]; local_1dc = local_1dc + 1) {
            local_1e8 = (color<unsigned_char,_2U> *)
                        (*(long *)(in_RSI + 0x18) + (ulong)(local_1d8 * local_fc[0] + local_1dc) * 2
                        );
            for (local_1ec = 0; local_1ec < 2; local_1ec = local_1ec + 1) {
              pbVar7 = color<unsigned_char,_2U>::operator[](local_1e8,local_1ec);
              in_stack_fffffffffffffd64 = (float)*pbVar7;
              bVar2 = color_base<unsigned_char,_2U>::one();
              local_1f0 = in_stack_fffffffffffffd64 * (1.0 / (float)bVar2);
              pRVar17 = local_1d0;
              if (local_1ec == 3) {
                pRVar17 = local_1c8;
              }
              vVar14 = (value_type)(**(code **)(*(long *)pRVar17 + 8))(local_1f0);
              pvVar8 = std::array<std::vector<float,_std::allocator<float>_>,_2UL>::operator[]
                                 (in_stack_fffffffffffffce0,(size_type)in_stack_fffffffffffffcd8);
              pvVar9 = std::vector<float,_std::allocator<float>_>::operator[]
                                 (pvVar8,(ulong)local_1dc);
              *pvVar9 = vVar14;
            }
          }
          for (local_1f4 = 0; local_1f4 < 2; local_1f4 = local_1f4 + 1) {
            std::
            array<std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>,_2UL>
            ::operator[]((array<std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>,_2UL>
                          *)in_stack_fffffffffffffce0,(size_type)in_stack_fffffffffffffcd8);
            pRVar6 = std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>::
                     operator->((unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>
                                 *)0x14fd17);
            pvVar8 = std::array<std::vector<float,_std::allocator<float>_>,_2UL>::operator[]
                               (in_stack_fffffffffffffce0,(size_type)in_stack_fffffffffffffcd8);
            std::vector<float,_std::allocator<float>_>::operator[](pvVar8,0);
            bVar2 = basisu::Resampler::put_line((float *)pRVar6);
            if ((bVar2 & 1) == 0) {
              std::
              array<std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>,_2UL>
              ::operator[]((array<std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>,_2UL>
                            *)in_stack_fffffffffffffce0,(size_type)in_stack_fffffffffffffcd8);
              std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>::operator*
                        ((unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_> *)
                         in_stack_fffffffffffffce0);
              checkResamplerStatus
                        (resampler,
                         (char *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
            }
          }
          while( true ) {
            memset(local_208,0,0x10);
            for (local_20c = 0; local_20c < 2; local_20c = local_20c + 1) {
              std::
              array<std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>,_2UL>
              ::operator[]((array<std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>,_2UL>
                            *)in_stack_fffffffffffffce0,(size_type)in_stack_fffffffffffffcd8);
              std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>::
              operator->((unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_> *)
                         0x14fdf0);
              pfVar10 = (value_type)basisu::Resampler::get_line();
              ppfVar11 = std::array<const_float_*,_2UL>::operator[]
                                   ((array<const_float_*,_2UL> *)in_stack_fffffffffffffce0,
                                    (size_type)in_stack_fffffffffffffcd8);
              *ppfVar11 = pfVar10;
            }
            ppfVar11 = std::array<const_float_*,_2UL>::operator[]
                                 ((array<const_float_*,_2UL> *)in_stack_fffffffffffffce0,
                                  (size_type)in_stack_fffffffffffffcd8);
            if (*ppfVar11 == (value_type)0x0) break;
            for (local_210 = 0; local_210 < local_dc[0]; local_210 = local_210 + 1) {
              pIVar4 = std::
                       unique_ptr<ImageT<unsigned_char,_2U>,_std::default_delete<ImageT<unsigned_char,_2U>_>_>
                       ::operator->((unique_ptr<ImageT<unsigned_char,_2U>,_std::default_delete<ImageT<unsigned_char,_2U>_>_>
                                     *)0x14fe78);
              pCVar1 = pIVar4->pixels;
              iVar13 = local_1d4 * local_dc[0];
              for (local_21c = 0; local_21c < 2; local_21c = local_21c + 1) {
                ppfVar11 = std::array<const_float_*,_2UL>::operator[]
                                     ((array<const_float_*,_2UL> *)in_stack_fffffffffffffce0,
                                      (size_type)in_stack_fffffffffffffcd8);
                if (local_21c == 3) {
                  local_2c8 = local_1c8;
                }
                else {
                  local_2c8 = local_1d0;
                }
                fVar15 = (float)(*(code *)**(undefined8 **)local_2c8)((*ppfVar11)[local_210]);
                uVar3 = std::isnan((double)(ulong)(uint)fVar15);
                if ((uVar3 & 1) == 0) {
                  if (0.0 <= fVar15) {
                    if (fVar15 <= 1.0) {
                      bVar2 = color_base<unsigned_char,_2U>::one();
                      uVar16 = (uchar)(int)(fVar15 * (float)bVar2 + 0.5);
                    }
                    else {
                      uVar16 = color_base<unsigned_char,_2U>::one();
                    }
                  }
                  else {
                    uVar16 = '\0';
                  }
                }
                else {
                  uVar16 = '\0';
                }
                puVar12 = color<unsigned_char,_2U>::operator[]
                                    (pCVar1 + (iVar13 + local_210),local_21c);
                *puVar12 = uVar16;
              }
            }
            local_1d4 = local_1d4 + 1;
          }
        }
        std::unique_ptr<Image,std::default_delete<Image>>::
        unique_ptr<ImageT<unsigned_char,2u>,std::default_delete<ImageT<unsigned_char,2u>>,void>
                  ((unique_ptr<Image,_std::default_delete<Image>_> *)in_stack_fffffffffffffcf0,
                   in_stack_fffffffffffffce8);
        TransferFunctionLinear::~TransferFunctionLinear((TransferFunctionLinear *)0x150085);
        TransferFunctionSRGB::~TransferFunctionSRGB((TransferFunctionSRGB *)0x150092);
        std::array<std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>,_2UL>
        ::~array((array<std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>,_2UL>
                  *)in_stack_fffffffffffffcf0);
        std::array<std::vector<float,_std::allocator<float>_>,_2UL>::~array
                  (in_stack_fffffffffffffcf0);
        std::unique_ptr<ImageT<unsigned_char,_2U>,_std::default_delete<ImageT<unsigned_char,_2U>_>_>
        ::~unique_ptr((unique_ptr<ImageT<unsigned_char,_2U>,_std::default_delete<ImageT<unsigned_char,_2U>_>_>
                       *)in_stack_fffffffffffffce0);
        return (__uniq_ptr_data<Image,_std::default_delete<Image>,_true,_true>)
               (tuple<Image_*,_std::default_delete<Image>_>)
               in_RDI.super___uniq_ptr_impl<Image,_std::default_delete<Image>_>._M_t.
               super__Tuple_impl<0UL,_Image_*,_std::default_delete<Image>_>.
               super__Head_base<0UL,_Image_*,_false>._M_head_impl;
      }
    }
    local_141 = 1;
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_68 = local_130;
    local_70 = "Image larger than max supported size of {}";
    local_18 = "Image larger than max supported size of {}";
    local_130[0] = "Image larger than max supported size of {}";
    local_10 = local_68;
    sStack_80 = std::char_traits<char>::length((char_type *)0x14f606);
    local_8 = local_70;
    local_140.int_value = 0x4000;
    local_78 = local_120;
    local_88 = local_130[0];
    local_60 = &local_88;
    local_58 = local_130[0];
    sStack_50 = sStack_80;
    local_c8[0] = ::fmt::v10::
                  make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,int>
                            ((format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_int>
                              *)&local_140.string,this_01,(int *)local_78);
    local_40 = &stack0xffffffffffffff50;
    local_48 = local_c8;
    local_28 = 1;
    uVar18 = 1;
    fmt.size_ = (size_t)local_130[0];
    fmt.data_ = (char *)local_48;
    local_38 = local_48;
    local_30 = local_48;
    local_20 = local_40;
    ::fmt::v10::vformat_abi_cxx11_(fmt,in_stack_ffffffffffffff48);
    std::runtime_error::runtime_error(this_00,local_120);
    local_141 = 0;
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  __assert_fail("sourceWidth && sourceHeight && targetWidth && targetHeight",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./image.hpp"
                ,0x461,
                "virtual std::unique_ptr<Image> ImageT<unsigned char, 2>::resample(uint32_t, uint32_t, const char *, float, basisu::Resampler::Boundary_Op) [componentType = unsigned char, componentCount = 2]"
               );
}

Assistant:

virtual std::unique_ptr<Image> resample(uint32_t targetWidth, uint32_t targetHeight,
            const char* filter, float filterScale, basisu::Resampler::Boundary_Op wrapMode) override {
        using namespace basisu;

        auto target = std::make_unique<ImageT<componentType, componentCount>>(targetWidth, targetHeight);
        target->setTransferFunction(transferFunction);
        target->setPrimaries(primaries);

        const auto sourceWidth = width;
        const auto sourceHeight = height;
        assert(sourceWidth && sourceHeight && targetWidth && targetHeight);

        if (std::max(sourceWidth, sourceHeight) > BASISU_RESAMPLER_MAX_DIMENSION ||
                std::max(targetWidth, targetHeight) > BASISU_RESAMPLER_MAX_DIMENSION) {
            throw std::runtime_error(fmt::format(
                    "Image larger than max supported size of {}", BASISU_RESAMPLER_MAX_DIMENSION));
        }

        std::array<std::vector<float>, componentCount> samples;
        std::array<std::unique_ptr<Resampler>, componentCount> resamplers;

        // Float types handled as SFloat HDR otherwise UNROM LDR is assumed
        const auto isHDR = std::is_floating_point_v<componentType>;

        for (uint32_t i = 0; i < componentCount; ++i) {
            resamplers[i] = std::make_unique<Resampler>(
                    sourceWidth, sourceHeight,
                    targetWidth, targetHeight,
                    wrapMode,
                    0.0f, isHDR ? 0.0f : 1.0f,
                    filter,
                    i == 0 ? nullptr : resamplers[0]->get_clist_x(),
                    i == 0 ? nullptr : resamplers[0]->get_clist_y(),
                    filterScale, filterScale,
                    0.f, 0.f);
            checkResamplerStatus(*resamplers[i], filter);
            samples[i].resize(sourceWidth);
        }

        const TransferFunctionSRGB tfSRGB;
        const TransferFunctionLinear tfLinear;
        const TransferFunction& tf = transferFunction == KHR_DF_TRANSFER_SRGB ?
                static_cast<const TransferFunction&>(tfSRGB) :
                static_cast<const TransferFunction&>(tfLinear);

        uint32_t targetY = 0;
        for (uint32_t sourceY = 0; sourceY < sourceHeight; ++sourceY) {
            // Put source lines into resampler(s)
            for (uint32_t sourceX = 0; sourceX < sourceWidth; ++sourceX) {
                const auto& sourcePixel = pixels[sourceY * sourceWidth + sourceX];
                for (uint32_t c = 0; c < componentCount; ++c) {
                    const float value = std::is_floating_point_v<componentType> ?
                            sourcePixel[c] :
                            static_cast<float>(sourcePixel[c]) * (1.f / static_cast<float>(Color::one()));

                    // c == 3: Alpha channel always uses tfLinear
                    samples[c][sourceX] = (c == 3 ? tfLinear : tf).decode(value);
                }
            }

            for (uint32_t c = 0; c < componentCount; ++c)
                if (!resamplers[c]->put_line(&samples[c][0]))
                    checkResamplerStatus(*resamplers[c], filter);

            // Retrieve any output lines
            while (true) {
                std::array<const float*, componentCount> outputLine{nullptr};
                for (uint32_t c = 0; c < componentCount; ++c)
                    outputLine[c] = resamplers[c]->get_line();

                if (outputLine[0] == nullptr)
                    break; // No new output line, break from retrieve and place in a new source line

                for (uint32_t targetX = 0; targetX < targetWidth; ++targetX) {
                    Color& targetPixel = target->pixels[targetY * targetWidth + targetX];
                    for (uint32_t c = 0; c < componentCount; ++c) {
                        const auto linearValue = outputLine[c][targetX];

                        // c == 3: Alpha channel always uses tfLinear
                        const float outValue = (c == 3 ? tfLinear : tf).encode(linearValue);
                        if constexpr (std::is_floating_point_v<componentType>) {
                            targetPixel[c] = outValue;
                        } else {
                            const auto unormValue =
                                std::isnan(outValue) ? componentType{0} :
                                outValue < 0.f ? componentType{0} :
                                outValue > 1.f ? Color::one() :
                                static_cast<componentType>(outValue * static_cast<float>(Color::one()) + 0.5f);
                            targetPixel[c] = unormValue;
                        }
                    }
                }

                ++targetY;
            }
        }

        return target;
    }